

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_variable_type_string(char *type,size_t *size,adios2_variable *variable)

{
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for const adios2_variable, in call to adios2_variable_type_string"
             ,(allocator *)&local_78);
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_58,"for size_t* length, in call to adios2_variable_type_string",
             (allocator *)&local_78);
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  adios2::ToString_abi_cxx11_((DataType)&local_78);
  anon_unknown.dwarf_34b7e::String2CAPI(&local_78,type,size);
  std::__cxx11::string::~string((string *)&local_78);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_type_string(char *type, size_t *size, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for const adios2_variable, in call to "
                                                  "adios2_variable_type_string");
        adios2::helper::CheckForNullptr(
            size, "for size_t* length, in call to adios2_variable_type_string");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);
        return String2CAPI(ToString(variableBase->m_Type), type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_variable_type_string"));
    }
}